

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void print_m2v(FILE *out,char *indent,m2v *M)

{
  uint uVar1;
  char *pcVar2;
  int c;
  int c_00;
  int r;
  int r_00;
  
  for (r_00 = 0; r_00 < *(int *)indent; r_00 = r_00 + 1) {
    pcVar2 = " ";
    if (r_00 == 0) {
      pcVar2 = "[";
    }
    fprintf((FILE *)out,"%s%s","  ",pcVar2);
    for (c_00 = 0; c_00 < *(int *)(indent + 4); c_00 = c_00 + 1) {
      uVar1 = m2v_get_el((m2v *)indent,r_00,c_00);
      fprintf((FILE *)out,"%d",(ulong)uVar1);
    }
    pcVar2 = "";
    if (r_00 == *(int *)indent + -1) {
      pcVar2 = " ]";
    }
    fprintf((FILE *)out,"%s\n",pcVar2);
  }
  return;
}

Assistant:

UNUSED
static void print_m2v(FILE* out, const char* indent, const m2v* M)
{
	for (int r = 0; r < M->n_row; ++r) {
		fprintf(out, "%s%s", indent, (r == 0 ? "[" : " "));
		for (int c = 0; c < M->n_col; ++c) {
			fprintf(out, "%d", (int)m2v_get_el(M, r, c));
		}
		fprintf(out, "%s\n", ((r == M->n_row - 1) ? " ]" : ""));
	}
}